

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

void __thiscall
crnd::static_huffman_data_model::~static_huffman_data_model(static_huffman_data_model *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x20) != 0) {
    crnd_delete<crnd::prefix_coding::decoder_tables>((decoder_tables *)0x11eb58);
  }
  vector<unsigned_char>::~vector((vector<unsigned_char> *)0x11eb6a);
  return;
}

Assistant:

static_huffman_data_model::~static_huffman_data_model() {
  if (m_pDecode_tables)
    crnd_delete(m_pDecode_tables);
}